

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseUser.cpp
# Opt level: O2

void __thiscall
BaseUser::BaseUser(BaseUser *this,char *passedFirstName,char *passedLastName,char *passedEmail,
                  char *passedPassword,bool passedAdmin)

{
  undefined1 *__dest;
  BaseUser *pBVar1;
  undefined3 in_register_00000089;
  allocator local_6d;
  undefined4 local_6c;
  char *local_68;
  char *local_60;
  char *local_58;
  string local_50;
  
  local_6c = CONCAT31(in_register_00000089,passedAdmin);
  local_60 = passedLastName;
  local_58 = passedPassword;
  Model<BaseUser>::Model(&this->super_Model<BaseUser>);
  (this->super_Model<BaseUser>)._vptr_Model = (_func_int **)&PTR_save_00138268;
  __dest = &(this->super_Model<BaseUser>).field_0xc;
  local_68 = this->email;
  memset(__dest,0,0xe0);
  this->admin = SUB41(local_6c,0);
  strcpy(__dest,passedFirstName);
  strcpy(this->lastName,local_60);
  strcpy(this->password,local_58);
  strcpy(local_68,passedEmail);
  std::__cxx11::string::string((string *)&local_50,passedEmail,&local_6d);
  pBVar1 = findByEmail(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (pBVar1 != (BaseUser *)0x0) {
    (this->super_Model<BaseUser>).id = (pBVar1->super_Model<BaseUser>).id;
  }
  return;
}

Assistant:

BaseUser::BaseUser(const char *passedFirstName, const char *passedLastName, const char *passedEmail,
                   const char *passedPassword, bool passedAdmin) : admin(passedAdmin) {
    strcpy(firstName, passedFirstName);
    strcpy(lastName, passedLastName);
    strcpy(password, passedPassword);
    strcpy(email, passedEmail);
    BaseUser *user = BaseUser::findByEmail(passedEmail);
    if(user) id = user->getId();
}